

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# despacer.c
# Opt level: O2

size_t sse42_despace_to(char *bytes,size_t howmany,char *out)

{
  byte bVar1;
  int iVar2;
  size_t sVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  
  auVar5._8_4_ = 0x200a0d20;
  auVar5._0_8_ = 0x200a0d20200a0d20;
  auVar5._12_4_ = 0x200a0d20;
  sVar3 = 0;
  for (uVar4 = 0; uVar4 + 0xf < howmany; uVar4 = uVar4 + (long)(int)((uint)(iVar2 < 0x10) + iVar2))
  {
    vpcmpestri_avx(auVar5,*(undefined1 (*) [16])(bytes + uVar4),0);
    *(undefined1 (*) [16])(out + sVar3) = *(undefined1 (*) [16])(bytes + uVar4);
    iVar2 = (int)(uVar4 + 0xf);
    sVar3 = sVar3 + (long)iVar2;
  }
  for (; uVar4 < howmany; uVar4 = uVar4 + 1) {
    bVar1 = bytes[uVar4];
    if ((0x20 < (ulong)bVar1) || ((0x100002400U >> ((ulong)bVar1 & 0x3f) & 1) == 0)) {
      out[sVar3] = bVar1;
      sVar3 = sVar3 + 1;
    }
  }
  return sVar3;
}

Assistant:

size_t sse42_despace_to(const char *restrict bytes,
                                      size_t howmany, char *restrict out) {
  size_t pos = 0;
  __m128i targetchars =
      _mm_set_epi8(' ', '\n', '\r', ' ', ' ', '\n', '\r', ' ', ' ', '\n', '\r',
                   ' ', ' ', '\n', '\r', ' ');
  size_t i = 0;
  for (; i + 15 < howmany;) {
    __m128i x = _mm_loadu_si128((const __m128i *)(bytes + i));
    int result =
        _mm_cmpestri(targetchars, 3, x, 16,
                     _SIDD_UBYTE_OPS | _SIDD_CMP_EQUAL_ANY | _SIDD_BIT_MASK);
    i += result + (result < 16);
    _mm_storeu_si128((__m128i *)(out + pos), x);
    pos += result;
  }
  for (; i < howmany; i++) {
    char c = bytes[i];
    if (c == '\r' || c == '\n' || c == ' ') {
      continue;
    }
    out[pos++] = c;
  }
  return pos;
}